

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

void MeCab::remove_filename(string *s)

{
  long lVar1;
  ulong uVar2;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  uVar2 = (ulong)s->_M_string_length & 0xffffffff;
  do {
    if ((int)uVar2 < 1) {
      std::__cxx11::string::_M_replace((ulong)s,0,(char *)s->_M_string_length,0x184a42);
      return;
    }
    lVar1 = uVar2 - 1;
    uVar2 = uVar2 - 1;
  } while ((s->_M_dataplus)._M_p[lVar1] != '/');
  std::__cxx11::string::substr((ulong)local_30,(ulong)s);
  std::__cxx11::string::operator=((string *)s,(string *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return;
}

Assistant:

void remove_filename(std::string *s) {
  int len = static_cast<int>(s->size()) - 1;
  bool ok = false;
  for (; len >= 0; --len) {
#if defined(_WIN32) && !defined(__CYGWIN__)
    if ((*s)[len] == '\\') {
      ok = true;
      break;
    }
#else
    if ((*s)[len] == '/')  {
      ok = true;
      break;
    }
#endif
  }
  if (ok)
    *s = s->substr(0, len);
  else
    *s = ".";
}